

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O0

void anon_unknown.dwarf_57ca7::getDerivatives
               (vector<int,_std::allocator<int>_> *image,vector<int,_std::allocator<int>_> *first,
               vector<int,_std::allocator<int>_> *second)

{
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var1;
  const_iterator cVar2;
  const_iterator cVar3;
  iterator iVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  iterator iVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff68;
  difference_type in_stack_ffffffffffffff70;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff78;
  
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff68);
  _Var1 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
          operator+((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                    in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  cVar2 = std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff68);
  cVar3 = std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff68);
  iVar4 = std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff68);
  std::
  transform<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::minus<int>>
            (_Var1._M_current,cVar2._M_current,cVar3._M_current,iVar4._M_current);
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff68);
  _Var5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  iVar4 = std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff68);
  iVar6 = std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff68);
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff68);
  _Var7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::
  transform<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::minus<int>>
            (_Var5._M_current,iVar4._M_current,iVar6._M_current,_Var7._M_current);
  return;
}

Assistant:

void getDerivatives( const std::vector < int > & image, std::vector < int > & first, std::vector < int > & second )
    {
        // input array range is [0; n)
        // first deriviative range is [0; n - 1)
        // second deriviative range is [1; n - 1)
        std::transform( image.begin() + 1u, image.end(), image.begin(), first.begin(), std::minus<int>() );
        std::transform( first.begin() + 1u, first.end(), first.begin(), second.begin() + 1u, std::minus<int>() );
    }